

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

void Fl_Text_Display::scroll_timer_cb(void *user_data)

{
  int iVar1;
  int Y;
  int X;
  Fl_Text_Display *w;
  
  switch(scroll_direction) {
  case 1:
    iVar1 = scroll_amount + *(int *)((long)user_data + 0x104);
    *(undefined4 *)((long)user_data + 0x108) = *(undefined4 *)((long)user_data + 0xf8);
    *(int *)((long)user_data + 0x10c) = iVar1;
    iVar1 = *(int *)((long)user_data + 0x28);
    (**(code **)(*user_data + 0x20))
              (user_data,*(undefined4 *)((long)user_data + 0x20),
               *(undefined4 *)((long)user_data + 0x24),iVar1,*(undefined4 *)((long)user_data + 0x2c)
              );
    X = *(int *)((long)user_data + 0x188) + *(int *)((long)user_data + 0x180);
    Y = scroll_y;
    break;
  case 2:
    iVar1 = scroll_amount + *(int *)((long)user_data + 0x104);
    *(undefined4 *)((long)user_data + 0x108) = *(undefined4 *)((long)user_data + 0xf8);
    *(int *)((long)user_data + 0x10c) = iVar1;
    iVar1 = *(int *)((long)user_data + 0x28);
    (**(code **)(*user_data + 0x20))
              (user_data,*(undefined4 *)((long)user_data + 0x20),
               *(undefined4 *)((long)user_data + 0x24),iVar1,*(undefined4 *)((long)user_data + 0x2c)
              );
    X = *(int *)((long)user_data + 0x180);
    Y = scroll_y;
    break;
  case 3:
    *(int *)((long)user_data + 0x108) = scroll_amount + *(int *)((long)user_data + 0xf8);
    *(undefined4 *)((long)user_data + 0x10c) = *(undefined4 *)((long)user_data + 0x104);
    iVar1 = *(int *)((long)user_data + 0x28);
    (**(code **)(*user_data + 0x20))
              (user_data,*(undefined4 *)((long)user_data + 0x20),
               *(undefined4 *)((long)user_data + 0x24),iVar1,*(undefined4 *)((long)user_data + 0x2c)
              );
    X = scroll_x;
    Y = *(int *)((long)user_data + 0x184);
    break;
  case 4:
    *(int *)((long)user_data + 0x108) = scroll_amount + *(int *)((long)user_data + 0xf8);
    *(undefined4 *)((long)user_data + 0x10c) = *(undefined4 *)((long)user_data + 0x104);
    iVar1 = *(int *)((long)user_data + 0x28);
    (**(code **)(*user_data + 0x20))
              (user_data,*(undefined4 *)((long)user_data + 0x20),
               *(undefined4 *)((long)user_data + 0x24),iVar1,*(undefined4 *)((long)user_data + 0x2c)
              );
    X = scroll_x;
    Y = *(int *)((long)user_data + 0x18c) + *(int *)((long)user_data + 0x184);
    break;
  default:
    return;
  }
  iVar1 = xy_to_position((Fl_Text_Display *)user_data,X,Y,iVar1);
  fl_text_drag_me(iVar1,(Fl_Text_Display *)user_data);
  Fl::repeat_timeout(0.1,scroll_timer_cb,user_data);
  return;
}

Assistant:

void Fl_Text_Display::scroll_timer_cb(void *user_data) {
  Fl_Text_Display *w = (Fl_Text_Display*)user_data;
  int pos;
  switch (scroll_direction) {
    case 1: // mouse is to the right, scroll left
      w->scroll(w->mTopLineNum, w->mHorizOffset + scroll_amount);
      pos = w->xy_to_position(w->text_area.x + w->text_area.w, scroll_y, CURSOR_POS);
      break;
    case 2: // mouse is to the left, scroll right
      w->scroll(w->mTopLineNum, w->mHorizOffset + scroll_amount);
      pos = w->xy_to_position(w->text_area.x, scroll_y, CURSOR_POS);
      break;
    case 3: // mouse is above, scroll down
      w->scroll(w->mTopLineNum + scroll_amount, w->mHorizOffset);
      pos = w->xy_to_position(scroll_x, w->text_area.y, CURSOR_POS);
      break;
    case 4: // mouse is below, scroll up
      w->scroll(w->mTopLineNum + scroll_amount, w->mHorizOffset);
      pos = w->xy_to_position(scroll_x, w->text_area.y + w->text_area.h, CURSOR_POS);
      break;
    default:
      return;
  }
  fl_text_drag_me(pos, w);
  Fl::repeat_timeout(.1, scroll_timer_cb, user_data);
}